

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void __thiscall RingtoneScreen::RingtoneScreen(RingtoneScreen *this,QWidget *parent)

{
  QVBoxLayout *this_00;
  TextLabel *this_01;
  QByteArrayView QVar1;
  QString local_58;
  QArrayData *local_38;
  char16_t *pcStack_30;
  qsizetype local_28;
  
  QWidget::QWidget(&this->super_QWidget,parent,0);
  *(undefined ***)this = &PTR_metaObject_00196410;
  *(undefined ***)&this->field_0x10 = &PTR__RingtoneScreen_001965c0;
  this_00 = (QVBoxLayout *)operator_new(0x20);
  QVBoxLayout::QVBoxLayout(this_00,&this->super_QWidget);
  this_01 = (TextLabel *)operator_new(0x30);
  QtMWidgets::TextLabel::TextLabel(this_01,&this->super_QWidget,(WindowFlags)0x0);
  QVar1.m_data = (storage_type *)0x36;
  QVar1.m_size = (qsizetype)&local_38;
  QString::fromLatin1(QVar1);
  local_58.d.d = (Data *)local_38;
  local_58.d.ptr = pcStack_30;
  local_58.d.size = local_28;
  QtMWidgets::TextLabel::setText(this_01,&local_58);
  if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,8);
    }
  }
  QBoxLayout::addWidget(this_00,this_01,0,0);
  return;
}

Assistant:

RingtoneScreen( QWidget * parent )
		:	QWidget( parent )
	{
		QVBoxLayout * l = new QVBoxLayout( this );

		QtMWidgets::TextLabel * label = new QtMWidgets::TextLabel( this );
		label->setText( QLatin1String( "We have to implement list with "
			"ringtones in the future" ) );

		l->addWidget( label );
	}